

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  pointer __rhs;
  undefined1 local_508 [4];
  int e;
  allocator local_4e1;
  string local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [32];
  _Self local_480;
  _Base_ptr local_478;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  string local_430 [32];
  undefined1 local_410 [64];
  undefined1 local_3d0 [64];
  undefined1 local_390 [71];
  allocator local_349;
  string local_348 [32];
  undefined1 local_328 [96];
  string local_2c8 [32];
  undefined1 local_2a8 [96];
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  URL *local_200;
  URL *urlObject;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  undefined1 local_188 [8];
  HttpResponse response;
  undefined1 local_98 [8];
  HttpClient client;
  Log log;
  string local_38 [8];
  string adress;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No URL adress provided");
    std::operator<<(poVar2,"\n");
    argv_local._4_4_ = -1;
  }
  else {
    std::__cxx11::string::operator=(local_38,argv[1]);
    Log::Log((Log *)&client._log._printFunction,printOut);
    Log::Log((Log *)&response._log._printFunction,(Log *)&client._log._printFunction);
    HttpClient::HttpClient((HttpClient *)local_98,(Log *)&response._log._printFunction);
    Log::~Log((Log *)&response._log._printFunction);
    std::__cxx11::string::string(local_1a8,local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"GET",&local_1c9);
    HttpClient::RunRequest
              ((HttpResponse *)local_188,(HttpClient *)local_98,(string *)local_1a8,
               (string *)local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f0,"Client was called, ok!",(allocator *)((long)&urlObject + 7));
    printOut((string *)local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&urlObject + 7));
    local_200 = HttpResponse::GetRequestURL((HttpResponse *)local_188);
    if (local_200 == (URL *)0x0) {
      std::operator<<((ostream *)&std::cout,"The URL is dead");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"Request information-------------------",&local_221);
    printOut((string *)local_220);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    URL::GetFullURL_abi_cxx11_((URL *)(local_2a8 + 0x40));
    std::operator+((char *)local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Full URL: "
                  );
    printOut(local_248);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)(local_2a8 + 0x40));
    URL::GetProtocoll_abi_cxx11_((URL *)local_2a8);
    std::operator+(local_2a8 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Protocoll: ");
    printOut((string *)(local_2a8 + 0x20));
    std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
    std::__cxx11::string::~string((string *)local_2a8);
    URL::GetHostName_abi_cxx11_((URL *)(local_328 + 0x40));
    std::operator+((char *)local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Host name: ");
    printOut(local_2c8);
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)(local_328 + 0x40));
    URL::GetPortNumber_abi_cxx11_((URL *)local_328);
    std::operator+(local_328 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Port number: ");
    printOut((string *)(local_328 + 0x20));
    std::__cxx11::string::~string((string *)(local_328 + 0x20));
    std::__cxx11::string::~string((string *)local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"Basic information---------------------",&local_349);
    printOut((string *)local_348);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    HttpResponse::GetHttpVersion_abi_cxx11_((HttpResponse *)local_390);
    std::operator+(local_390 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Version: ")
    ;
    printOut((string *)(local_390 + 0x20));
    std::__cxx11::string::~string((string *)(local_390 + 0x20));
    std::__cxx11::string::~string((string *)local_390);
    HttpResponse::GetHttpStatusCode_abi_cxx11_((HttpResponse *)local_3d0);
    std::operator+(local_3d0 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Status code: ");
    printOut((string *)(local_3d0 + 0x20));
    std::__cxx11::string::~string((string *)(local_3d0 + 0x20));
    std::__cxx11::string::~string((string *)local_3d0);
    HttpResponse::GetHttpStatusText_abi_cxx11_((HttpResponse *)local_410);
    std::operator+(local_410 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Status text: ");
    printOut((string *)(local_410 + 0x20));
    std::__cxx11::string::~string((string *)(local_410 + 0x20));
    std::__cxx11::string::~string((string *)local_410);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_430,"Header information---------------------",
               (allocator *)((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    printOut((string *)local_430);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    HttpResponse::GetHttpHeaders_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&it,(HttpResponse *)local_188);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_iterator(&local_470);
    local_478 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&it);
    local_470._M_node = local_478;
    while( true ) {
      local_480._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&it);
      bVar1 = std::operator!=(&local_470,&local_480);
      if (!bVar1) break;
      __rhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_470);
      std::operator+(local_4c0,(char *)__rhs);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_470);
      std::operator+(local_4a0,local_4c0);
      printOut(local_4a0);
      std::__cxx11::string::~string((string *)local_4a0);
      std::__cxx11::string::~string((string *)local_4c0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_470);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"Raw response-------------------------",&local_4e1);
    printOut((string *)local_4e0);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    HttpResponse::GetRawResponse_abi_cxx11_((HttpResponse *)local_508);
    printOut((string *)local_508);
    std::__cxx11::string::~string((string *)local_508);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&it);
    HttpResponse::~HttpResponse((HttpResponse *)local_188);
    argv_local._4_4_ = 0;
    HttpClient::~HttpClient((HttpClient *)local_98);
    Log::~Log((Log *)&client._log._printFunction);
  }
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  std::string adress;
  if (argc > 1) {
    adress = argv[1];
  } else {
    std::cout << "No URL adress provided" << "\n";
    return -1;
  }

  Log log(printOut);
  HttpClient client(log);

  try {
    HttpResponse response = client.RunRequest(adress, "GET");
    printOut("Client was called, ok!");
    URL* urlObject = response.GetRequestURL();

    if (urlObject == nullptr) {
      std::cout << "The URL is dead";
    }

    printOut("Request information-------------------");
    printOut("Full URL: " + urlObject->GetFullURL());
    printOut("Protocoll: " + urlObject->GetProtocoll());
    printOut("Host name: " + urlObject->GetHostName());
    printOut("Port number: " + urlObject->GetPortNumber());

    printOut("Basic information---------------------");
    printOut("Version: " + response.GetHttpVersion());
    printOut("Status code: " + response.GetHttpStatusCode());
    printOut("Status text: " + response.GetHttpStatusText());

    printOut("Header information---------------------");
    std::map<std::string, std::string> headers = response.GetHttpHeaders();
    std::map<std::string, std::string>::iterator it;
    for (it=headers.begin(); it != headers.end(); ++it) {
      printOut(it->first + ": " + it->second);
    }
    printOut("Raw response-------------------------");
    printOut(response.GetRawResponse());
  } catch (int e) {
      printOut("An unhandled exception occured");
  }
  return 0;
}